

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawSpanPalCommand::Execute(DrawSpanPalCommand *this,DrawerThread *thread)

{
  dsfixed_t dVar1;
  dsfixed_t dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  bool bVar8;
  byte bVar9;
  int xmask;
  uint8_t xshift;
  int iStack_44;
  uint8_t yshift;
  int spot;
  int count;
  uint8_t *colormap;
  uint8_t *source;
  uint8_t *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  DrawerThread *thread_local;
  DrawSpanPalCommand *this_local;
  
  bVar8 = DrawerThread::line_skipped_by_thread(thread,(this->super_PalSpanCommand)._y);
  if (!bVar8) {
    puVar6 = (this->super_PalSpanCommand)._source;
    puVar7 = (this->super_PalSpanCommand)._colormap;
    xstep = (this->super_PalSpanCommand)._xfrac;
    ystep = (this->super_PalSpanCommand)._yfrac;
    source = (this->super_PalSpanCommand)._destorg +
             (*(int *)(ylookup + (long)(this->super_PalSpanCommand)._y * 4) +
             (this->super_PalSpanCommand)._x1);
    iStack_44 = ((this->super_PalSpanCommand)._x2 - (this->super_PalSpanCommand)._x1) + 1;
    dVar1 = (this->super_PalSpanCommand)._xstep;
    dVar2 = (this->super_PalSpanCommand)._ystep;
    if (((this->super_PalSpanCommand)._xbits == 6) && ((this->super_PalSpanCommand)._ybits == 6)) {
      do {
        *source = puVar7[puVar6[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))]];
        xstep = dVar1 + xstep;
        ystep = dVar2 + ystep;
        iStack_44 = iStack_44 + -1;
        source = source + 1;
      } while (iStack_44 != 0);
    }
    else {
      bVar9 = 0x20 - (char)(this->super_PalSpanCommand)._ybits;
      iVar3 = (this->super_PalSpanCommand)._xbits;
      iVar4 = (this->super_PalSpanCommand)._xbits;
      iVar5 = (this->super_PalSpanCommand)._ybits;
      do {
        *source = puVar7[puVar6[(int)((xstep >> (bVar9 - (char)iVar3 & 0x1f) &
                                      (1 << ((byte)iVar4 & 0x1f)) + -1 << ((byte)iVar5 & 0x1f)) +
                                     (ystep >> (bVar9 & 0x1f)))]];
        xstep = dVar1 + xstep;
        ystep = dVar2 + ystep;
        iStack_44 = iStack_44 + -1;
        source = source + 1;
      } while (iStack_44 != 0);
    }
  }
  return;
}

Assistant:

void DrawSpanPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				// Current texture index in u,v.
				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));

				// Lookup pixel from flat texture tile,
				//  re-index using light/colormap.
				*dest++ = colormap[source[spot]];

				// Next step in u,v.
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;

			do
			{
				// Current texture index in u,v.
				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);

				// Lookup pixel from flat texture tile,
				//  re-index using light/colormap.
				*dest++ = colormap[source[spot]];

				// Next step in u,v.
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}